

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ulong uVar1;
  LogMessage *other;
  ulong uVar2;
  undefined8 *puVar3;
  Message *pMVar4;
  long *plVar5;
  long *plVar6;
  ThreadSafeArena *pTVar7;
  ThreadSafeArena *pTVar8;
  ThreadSafeArena *this_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (sub_message == (Message *)0x0) {
    UnsafeArenaSetAllocatedMessage(this,message,(Message *)0x0,field);
    return;
  }
  uVar2 = (sub_message->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 2) == 0) {
    plVar5 = (long *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) == 0) {
      if (plVar5 != (long *)0x0) {
LAB_00395a98:
        uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
        plVar6 = (long *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          plVar6 = (long *)*plVar6;
        }
        if (plVar5 != plVar6) {
          internal::LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x7f9);
          other = internal::LogMessage::operator<<
                            (&local_60,
                             "CHECK failed: sub_message == nullptr || sub_message->GetOwningArena() == nullptr || sub_message->GetOwningArena() == message->GetArenaForAllocation(): "
                            );
          internal::LogFinisher::operator=(&local_61,other);
          internal::LogMessage::~LogMessage(&local_60);
          uVar2 = (sub_message->super_MessageLite)._internal_metadata_.ptr_;
        }
      }
    }
    else if (*plVar5 != 0) {
      plVar5 = (long *)*plVar5;
      goto LAB_00395a98;
    }
  }
  if ((uVar2 & 2) == 0) {
    pTVar7 = (ThreadSafeArena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pTVar7 = *(ThreadSafeArena **)pTVar7;
    }
  }
  else {
    pTVar7 = (ThreadSafeArena *)0x0;
  }
  uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
  this_00 = (ThreadSafeArena *)(uVar1 & 0xfffffffffffffffc);
  pTVar8 = this_00;
  if ((uVar1 & 1) != 0) {
    pTVar8 = *(ThreadSafeArena **)this_00;
  }
  if (pTVar7 == pTVar8) {
LAB_00395b72:
    UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  }
  else {
    if ((uVar2 & 2) == 0) {
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 == (undefined8 *)0x0) goto LAB_00395b59;
    }
    else {
LAB_00395b59:
      if ((uVar1 & 1) != 0) {
        this_00 = *(ThreadSafeArena **)this_00;
      }
      if (this_00 != (ThreadSafeArena *)0x0) {
        internal::ThreadSafeArena::AddCleanup
                  (this_00,sub_message,internal::arena_delete_object<google::protobuf::MessageLite>)
        ;
        goto LAB_00395b72;
      }
    }
    pMVar4 = MutableMessage(this,message,field,(MessageFactory *)0x0);
    (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xd])(pMVar4,sub_message);
  }
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  GOOGLE_DCHECK(sub_message == nullptr || sub_message->GetOwningArena() == nullptr ||
         sub_message->GetOwningArena() == message->GetArenaForAllocation());
  CheckInvalidAccess(schema_, field);

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != nullptr &&
      sub_message->GetOwningArena() != message->GetArenaForAllocation()) {
    if (sub_message->GetOwningArena() == nullptr &&
        message->GetArenaForAllocation() != nullptr) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArenaForAllocation()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}